

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

int mbedtls_asn1_write_algorithm_identifier
              (uchar **p,uchar *start,char *oid,size_t oid_len,size_t par_len)

{
  uchar *puVar1;
  uint uVar2;
  ulong uVar3;
  
  if (par_len == 0) {
    puVar1 = *p;
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      return -0x6c;
    }
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    puVar1 = *p;
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      return -0x6c;
    }
    *p = puVar1 + -1;
    puVar1[-1] = '\x05';
    par_len = 2;
  }
  uVar2 = mbedtls_asn1_write_oid(p,start,oid,oid_len);
  if (-1 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
    uVar2 = mbedtls_asn1_write_len(p,start,par_len + uVar3);
    if (-1 < (int)uVar2) {
      puVar1 = *p;
      if (puVar1 == start || (long)puVar1 - (long)start < 0) {
        uVar2 = 0xffffff94;
      }
      else {
        *p = puVar1 + -1;
        puVar1[-1] = '0';
        uVar2 = uVar2 + (int)(par_len + uVar3) + 1;
      }
    }
  }
  return uVar2;
}

Assistant:

int mbedtls_asn1_write_algorithm_identifier( unsigned char **p, unsigned char *start,
                                     const char *oid, size_t oid_len,
                                     size_t par_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    if( par_len == 0 )
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_null( p, start ) );
    else
        len += par_len;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_oid( p, start, oid, oid_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start,
                                       MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}